

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O0

void __thiscall
DBaseStatusBar::AttachMessage(DBaseStatusBar *this,DHUDMessage *msg,DWORD id,int layer)

{
  bool bVar1;
  DHUDMessage *local_48;
  DBaseStatusBar *local_38;
  DObject *container;
  DHUDMessage **prev;
  DHUDMessage *old;
  int layer_local;
  DWORD id_local;
  DHUDMessage *msg_local;
  DBaseStatusBar *this_local;
  
  if ((id == 0) || (id == 0xffffffff)) {
    local_48 = (DHUDMessage *)0x0;
  }
  else {
    local_48 = DetachMessage(this,id);
  }
  if (local_48 != (DHUDMessage *)0x0) {
    (*(local_48->super_DObject)._vptr_DObject[4])();
  }
  old._0_4_ = layer;
  if (2 < (uint)layer) {
    old._0_4_ = 0;
  }
  container = (DObject *)TObjPtr<DHUDMessage>::operator&(this->Messages + (int)old);
  local_38 = this;
  while( true ) {
    bVar1 = false;
    if (container->_vptr_DObject != (_func_int **)0x0) {
      bVar1 = id < *(uint *)(container->_vptr_DObject + 0x16);
    }
    if (!bVar1) break;
    local_38 = (DBaseStatusBar *)container->_vptr_DObject;
    container = (DObject *)
                TObjPtr<DHUDMessage>::operator&
                          ((TObjPtr<DHUDMessage> *)(container->_vptr_DObject + 0x15));
  }
  TObjPtr<DHUDMessage>::operator=(&msg->Next,(DHUDMessage *)container->_vptr_DObject);
  msg->SBarID = id;
  container->_vptr_DObject = (_func_int **)msg;
  GC::WriteBarrier(&local_38->super_DObject,&msg->super_DObject);
  return;
}

Assistant:

void DBaseStatusBar::AttachMessage (DHUDMessage *msg, DWORD id, int layer)
{
	DHUDMessage *old = NULL;
	DHUDMessage **prev;
	DObject *container = this;

	old = (id == 0 || id == 0xFFFFFFFF) ? NULL : DetachMessage (id);
	if (old != NULL)
	{
		old->Destroy();
	}

	// Merge unknown layers into the default layer.
	if ((size_t)layer >= countof(Messages))
	{
		layer = HUDMSGLayer_Default;
	}

	prev = &Messages[layer];

	// The ID serves as a priority, where lower numbers appear in front of
	// higher numbers. (i.e. The list is sorted in descending order, since
	// it gets drawn back to front.)
	while (*prev != NULL && (*prev)->SBarID > id)
	{
		container = *prev;
		prev = &(*prev)->Next;
	}

	msg->Next = *prev;
	msg->SBarID = id;
	*prev = msg;
	GC::WriteBarrier(container, msg);
}